

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testchar.c
# Opt level: O3

void testDocumentRangeByte2(xmlParserCtxtPtr ctxt,char *document,int len,char *data)

{
  long lVar1;
  char *__format;
  int i;
  uint uVar2;
  uint uVar3;
  undefined8 local_38;
  
  local_38 = (ulong)(uint)len << 0x20;
  uVar2 = 0x80;
  do {
    local_38 = CONCAT44(local_38._4_4_,uVar2) & 0xffffffff000000e0;
    uVar3 = 0;
    do {
      lastError = 0;
      xmlCtxtReset(ctxt);
      *data = (char)uVar2;
      data[1] = (char)uVar3;
      lVar1 = xmlReadMemory(document,local_38._4_4_,"test",0,0);
      if ((((uVar2 & 0x40) == 0) || ((uVar3 & 0xc0) != 0x80)) || ((uVar2 & 0x1e) == 0)) {
        __format = "Failed to detect invalid char for Bytes 0x%02X 0x%02X\n";
        if (lastError == 0) {
LAB_00101fb8:
          fprintf(_stderr,__format,(ulong)uVar2);
          if (lVar1 != 0) goto LAB_00101fd4;
        }
        else {
          __format = "Failed to detect invalid char for Bytes 0x%02X 0x%02X\n";
LAB_00101f8a:
          if (lVar1 != 0) goto LAB_00101fb8;
        }
      }
      else {
        if ((int)local_38 == 0xe0) {
          __format = "Failed to detect invalid char for Bytes 0x%02X 0x%02X 0x00\n";
          if (lastError != 0) {
            __format = "Failed to detect invalid char for Bytes 0x%02X 0x%02X 0x00\n";
            goto LAB_00101f8a;
          }
          goto LAB_00101fb8;
        }
        __format = "Failed to parse document for Bytes 0x%02X 0x%02X\n";
        if ((lastError != 0) ||
           (__format = "Failed to parse document for Bytes 0x%02X 0x%02X\n", lVar1 == 0))
        goto LAB_00101fb8;
LAB_00101fd4:
        xmlFreeDoc(lVar1);
      }
      uVar3 = uVar3 + 1;
    } while (uVar3 != 0x100);
    uVar2 = uVar2 + 1;
    if (uVar2 == 0x100) {
      return;
    }
  } while( true );
}

Assistant:

static void testDocumentRangeByte2(xmlParserCtxtPtr ctxt, char *document,
                  int len,  char *data) {
    int i, j;
    xmlDocPtr res;

    for (i = 0x80;i <= 0xFF;i++) {
    for (j = 0;j <= 0xFF;j++) {
	lastError = 0;
	xmlCtxtReset(ctxt);

        data[0] = i;
        data[1] = j;

	res = xmlReadMemory(document, len, "test", NULL, 0);

	/* if first bit of first char is set, then second bit must too */
	if ((i & 0x80) && ((i & 0x40) == 0)) {
	    if ((lastError == 0) || (res != NULL))
		fprintf(stderr,
		"Failed to detect invalid char for Bytes 0x%02X 0x%02X\n",
			i, j);
	}

	/*
	 * if first bit of first char is set, then second char first
	 * bits must be 10
	 */
	else if ((i & 0x80) && ((j & 0xC0) != 0x80)) {
	    if ((lastError == 0) || (res != NULL))
		fprintf(stderr,
	    "Failed to detect invalid char for Bytes 0x%02X 0x%02X\n",
			i, j);
	}

	/*
	 * if using a 2 byte encoding then the value must be greater
	 * than 0x80, i.e. one of bits 5 to 1 of i must be set
	 */
	else if ((i & 0x80) && ((i & 0x1E) == 0)) {
	    if ((lastError == 0) || (res != NULL))
		fprintf(stderr,
	    "Failed to detect invalid char for Bytes 0x%02X 0x%02X\n",
			i, j);
	}

	/*
	 * if third bit of first char is set, then the sequence would need
	 * at least 3 bytes, but we give only 2 !
	 */
	else if ((i & 0xE0) == 0xE0) {
	    if ((lastError == 0) || (res != NULL))
		fprintf(stderr,
	    "Failed to detect invalid char for Bytes 0x%02X 0x%02X 0x00\n",
			i, j);
	}

	/*
	 * We should see no error in remaining cases
	 */
	else if ((lastError != 0) || (res == NULL)) {
	    fprintf(stderr,
		"Failed to parse document for Bytes 0x%02X 0x%02X\n", i, j);
	}
	if (res != NULL)
	    xmlFreeDoc(res);
    }
    }
}